

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

void protodec_initialize(demod_state_t *d,serial_state_t *serial,char chanid)

{
  uchar *puVar1;
  char *pcVar2;
  char chanid_local;
  serial_state_t *serial_local;
  demod_state_t *d_local;
  
  memset(d,0,0x70);
  d->chanid = chanid;
  d->serial = serial;
  d->receivedframes = 0;
  d->lostframes = 0;
  d->lostframes2 = 0;
  protodec_reset(d);
  d->seqnr = '\0';
  puVar1 = (uchar *)hmalloc(0x1c2);
  d->buffer = puVar1;
  puVar1 = (uchar *)hmalloc(0x1c2);
  d->rbuffer = puVar1;
  pcVar2 = (char *)hmalloc(100);
  d->nmea = pcVar2;
  return;
}

Assistant:

void protodec_initialize(struct demod_state_t *d, struct serial_state_t *serial, char chanid)
{
	memset(d, 0, sizeof(struct demod_state_t));

	d->chanid = chanid;
	d->serial = serial;
	
	d->receivedframes = 0;
	d->lostframes = 0;
	d->lostframes2 = 0;
	
	protodec_reset(d);
	
	d->seqnr = 0;
	
    d->buffer = hmalloc(DEMOD_BUFFER_LEN);
    d->rbuffer = hmalloc(DEMOD_BUFFER_LEN);
    d->nmea = hmalloc(NMEABUFFER_LEN);
}